

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test3::writeUniformBlock
          (GPUShaderFP64Test3 *this,ostream *stream,uniformDataLayout uniform_data_layout)

{
  undefined *puVar1;
  size_t sVar2;
  bool *__s;
  
  if (uniform_data_layout < (STD140|SHARED)) {
    __s = *(bool **)(&DAT_020de808 + (ulong)uniform_data_layout * 8);
  }
  else {
    __s = ::glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"layout(",7);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(stream,") uniform ",10);
  puVar1 = m_uniform_block_name;
  if (m_uniform_block_name == (undefined *)0x0) {
    std::ios::clear((int)stream + (int)stream->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(m_uniform_block_name);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,
             "\n{\n    ivec3   dummy1[3];\n    double  double_value;\n    bool    dummy2;\n    dvec2   dvec2_value;\n    bvec3   dummy3;\n    dvec3   dvec3_value;\n    int     dummy4[3];\n    dvec4   dvec4_value;\n    bool    dummy5;\n    bool    dummy6[2];\n    dmat2   dmat2_value;\n    dmat3   dmat3_value;\n    bool    dummy7;\n    dmat4   dmat4_value;\n    dmat2x3 dmat2x3_value;\n    uvec3   dummy8;\n    dmat2x4 dmat2x4_value;\n    dmat3x2 dmat3x2_value;\n    bool    dummy9;\n    dmat3x4 dmat3x4_value;\n    int     dummy10;\n    dmat4x2 dmat4x2_value;\n    dmat4x3 dmat4x3_value;\n} "
             ,0x229);
  puVar1 = m_uniform_block_instance_name;
  if (m_uniform_block_instance_name == (undefined *)0x0) {
    std::ios::clear((int)stream + (int)stream->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(m_uniform_block_instance_name);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  return;
}

Assistant:

void GPUShaderFP64Test3::writeUniformBlock(std::ostream& stream, uniformDataLayout uniform_data_layout) const
{
	const glw::GLchar* layout = getUniformLayoutName(uniform_data_layout);

	stream << "layout(" << layout << ") uniform " << m_uniform_block_name << "\n"
																			 "{\n"
																			 "    ivec3   dummy1[3];\n"
																			 "    double  double_value;\n"
																			 "    bool    dummy2;\n"
																			 "    dvec2   dvec2_value;\n"
																			 "    bvec3   dummy3;\n"
																			 "    dvec3   dvec3_value;\n"
																			 "    int     dummy4[3];\n"
																			 "    dvec4   dvec4_value;\n"
																			 "    bool    dummy5;\n"
																			 "    bool    dummy6[2];\n"
																			 "    dmat2   dmat2_value;\n"
																			 "    dmat3   dmat3_value;\n"
																			 "    bool    dummy7;\n"
																			 "    dmat4   dmat4_value;\n"
																			 "    dmat2x3 dmat2x3_value;\n"
																			 "    uvec3   dummy8;\n"
																			 "    dmat2x4 dmat2x4_value;\n"
																			 "    dmat3x2 dmat3x2_value;\n"
																			 "    bool    dummy9;\n"
																			 "    dmat3x4 dmat3x4_value;\n"
																			 "    int     dummy10;\n"
																			 "    dmat4x2 dmat4x2_value;\n"
																			 "    dmat4x3 dmat4x3_value;\n"
																			 "} "
		   << m_uniform_block_instance_name << ";\n";

	stream << "\n";
}